

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QString>::
emplace<QStringBuilder<QStringBuilder<QString_const&,char16_t>,QString>>
          (QMovableArrayOps<QString> *this,qsizetype i,
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString> *args)

{
  qsizetype *pqVar1;
  QString **ppQVar2;
  Data *pDVar3;
  QString *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_70;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size == i) {
      qVar5 = QArrayDataPointer<QString>::freeSpaceAtEnd((QArrayDataPointer<QString> *)this);
      if (qVar5 == 0) goto LAB_0044ddf7;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
                ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr +
                 (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size,args)
      ;
LAB_0044df33:
      pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_0044def2;
    }
LAB_0044ddf7:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QString>::freeSpaceAtBegin((QArrayDataPointer<QString> *)this);
      if (qVar5 != 0) {
        QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
                  ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr + -1
                   ,args);
        ppQVar2 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_0044df33;
      }
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_QString>::convertTo<QString>
            ((QString *)&local_48,args);
  bVar6 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar6),1,(QString **)0x0,
             (QArrayDataPointer<QString> *)0x0);
  if (i == 0 && bVar6) {
    pQVar4 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
    pQVar4[-1].d.d = local_48.d;
    pQVar4[-1].d.ptr = local_48.ptr;
    pQVar4[-1].d.size = local_48.size;
    (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QString> *)this,i,1);
    ((local_70.displaceFrom)->d).d = local_48.d;
    ((local_70.displaceFrom)->d).ptr = local_48.ptr;
    ((local_70.displaceFrom)->d).size = local_48.size;
    local_70.displaceFrom = local_70.displaceFrom + 1;
    (local_70.data)->size = (local_70.data)->size + local_70.nInserts;
  }
  local_48.size = 0;
  local_48.ptr = (char16_t *)0x0;
  local_48.d = (Data *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
LAB_0044def2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }